

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

char * __thiscall FSerializer::GetKey(FSerializer *this)

{
  FJSONObject *pFVar1;
  Number this_00;
  uint uVar2;
  Ch *pCVar3;
  undefined8 local_20;
  
  if (this->w != (FWriter *)0x0) {
    return (char *)0x0;
  }
  pFVar1 = (this->r->mObjects).Array;
  uVar2 = (this->r->mObjects).Count - 1;
  if (((pFVar1[uVar2].mObject)->data_).f.flags == 3) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&stack0xffffffffffffffe0);
    this_00 = (Number)pFVar1[uVar2].mIterator.ptr_;
    if (this_00.i64 != local_20) {
      this->r->mKeyValue =
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)(this_00.i64 + 0x18);
      pFVar1[uVar2].mIterator.ptr_ = (Pointer)(this_00.i64 + 0x30);
      pCVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_00);
      return pCVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

bool isWriting() const
	{
		return w != nullptr;
	}